

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::LookUpEnumValue
          (internal *this,EnumEntry *enums,size_t size,string_view name,int *value)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  EnumEntry *pEVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  EnumEntry local_40;
  
  __y._M_str = (char *)name._M_len;
  local_40.value = 0;
  local_40.name._M_len = size;
  local_40.name._M_str = __y._M_str;
  pEVar2 = std::
           __lower_bound<google::protobuf::internal::EnumEntry_const*,google::protobuf::internal::EnumEntry,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(google::protobuf::internal::EnumEntry_const&,google::protobuf::internal::EnumEntry_const&)>>
                     ((EnumEntry *)this,(EnumEntry *)(this + (long)enums * 0x18),&local_40,
                      (_Iter_comp_val<bool_(*)(const_google::protobuf::internal::EnumEntry_&,_const_google::protobuf::internal::EnumEntry_&)>
                       )0x24ad89);
  if ((pEVar2 != (EnumEntry *)(this + (long)enums * 0x18)) &&
     (__x._M_len = (pEVar2->name)._M_len, __x._M_str = (pEVar2->name)._M_str, __y._M_len = size,
     bVar1 = std::operator==(__x,__y), bVar1)) {
    *(int *)name._M_str = pEVar2->value;
    return true;
  }
  return false;
}

Assistant:

bool LookUpEnumValue(const EnumEntry* enums, size_t size,
                     absl::string_view name, int* value) {
  EnumEntry target{name, 0};
  auto it = std::lower_bound(enums, enums + size, target, EnumCompareByName);
  if (it != enums + size && it->name == name) {
    *value = it->value;
    return true;
  }
  return false;
}